

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

ssw_file_t ssw_open_and_procrec0(char *filename)

{
  char *__s1;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  ssw_fileinternal_t *f;
  ulong *puVar11;
  ulong uVar12;
  long lVar13;
  void *__ptr;
  ssw_file_t ff;
  uint uVar14;
  FILE *pFVar15;
  long lVar16;
  char *__s2;
  char *pcVar17;
  size_t __n;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  char *tmp;
  char *local_48;
  uint64_t uStack_40;
  undefined8 local_38;
  
  f = (ssw_fileinternal_t *)calloc(1,0x1a0);
  if (f == (ssw_fileinternal_t *)0x0) {
LAB_00102d9a:
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ERROR: %s\n","memory allocation failure");
    exit(1);
  }
  (f->filehandle).internal = (void *)0x0;
  mcpl_generic_fopen(&local_48,filename);
  *(undefined8 *)&(f->filehandle).mode = local_38;
  (f->filehandle).internal = local_48;
  (f->filehandle).current_pos = uStack_40;
  f->lbufmax = 0x400;
  puVar11 = (ulong *)malloc(0x400);
  if (puVar11 == (ulong *)0x0) goto LAB_00102d9a;
  f->buf = (char *)puVar11;
  mcpl_generic_fread(&f->filehandle,puVar11,0x24);
  uVar14 = (uint)*puVar11;
  uVar20 = 0;
  uVar12 = *puVar11;
  f->reclen = 0;
  f->mcnp_type = 0;
  uVar18 = 99999;
  __n = 0x50;
  uVar19 = uVar18;
  if ((ulong)uVar14 == 8) {
    if (*(uint *)((long)puVar11 + 0xc) == 8) {
      uVar5 = (uint)puVar11[2];
      uVar19 = (ulong)uVar5;
      if (((uVar19 == 0xbf) || (uVar5 == 0x8f)) &&
         (0xa0 < (byte)(*(char *)((long)puVar11 + 0x14) + 0x81U))) {
        f->mcnp_type = 1;
        f->reclen = 4;
        if (uVar5 == 0xbf) {
          __n = 0x80;
        }
        uVar20 = 0x14;
        goto LAB_00102928;
      }
    }
    uVar19 = uVar18;
    if (((puVar11[2] == 8) && ((uVar3 = puVar11[3], uVar3 == 0xbf || (uVar3 == 0x8f)))) &&
       (uVar20 = 0, 0xa0 < (byte)((char)puVar11[4] + 0x81U))) {
      f->mcnp_type = 1;
      f->reclen = 8;
      if (uVar3 == 0xbf) {
        __n = 0x80;
      }
      uVar20 = 0x20;
      uVar19 = uVar3;
    }
  }
LAB_00102928:
  if (f->mcnp_type == 0) {
    if (((uVar14 & 0xfffffffb) == 0xa3) && (0xa0 < (byte)(*(char *)((long)puVar11 + 4) + 0x81U))) {
      f->mcnp_type = 2;
      f->reclen = 4;
      uVar20 = 4;
      uVar19 = (ulong)uVar14;
    }
    else if (((uVar12 & 0xfffffffffffffffb) == 0xa3) && (0xa0 < (byte)((char)puVar11[1] + 0x81U))) {
      f->mcnp_type = 2;
      f->reclen = 8;
      uVar20 = 8;
      uVar19 = uVar12;
    }
  }
  if ((f->mcnp_type == 0) &&
     (((uVar14 == 0x8f && (uVar14 = 4, 0xa0 < (byte)(*(char *)((long)puVar11 + 4) + 0x81U))) ||
      ((uVar12 == 0x8f && (uVar14 = 8, 0xa0 < (byte)((char)puVar11[1] + 0x81U))))))) {
    f->mcnp_type = 3;
    f->reclen = uVar14;
    uVar19 = 0x8f;
    uVar20 = (ulong)uVar14;
  }
  if (f->mcnp_type == 0) {
    pcVar17 = "ssw_open_file error: File does not look like a supported MCNP SSW file";
  }
  else {
    if (f->reclen == 8) {
      pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar15 = _stdout;
      }
      fwrite("ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x8b,1,pFVar15);
    }
    lVar13 = uVar19 + uVar20;
    mcpl_generic_fread(&f->filehandle,(uint *)((long)puVar11 + 0x24),
                       (long)(int)lVar13 + (long)f->reclen + -0x24);
    if (f->reclen == 4) {
      uVar12 = (ulong)*(uint *)((long)puVar11 + lVar13);
    }
    else {
      uVar12 = *(ulong *)((long)puVar11 + lVar13);
    }
    if (uVar19 == uVar12) {
      if (f->mcnp_type == 2) {
        lVar13 = (long)f->reclen;
        *(undefined8 *)f->kods = *(undefined8 *)((long)puVar11 + lVar13);
        f->vers[4] = *(char *)((long)puVar11 + lVar13 + 0xc);
        *(undefined4 *)f->vers = *(undefined4 *)((long)puVar11 + lVar13 + 8);
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0xd);
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0x19);
        uVar8 = puVar1[1];
        *(undefined8 *)(f->lods + 0xc) = *puVar1;
        *(undefined8 *)(f->lods + 0x14) = uVar8;
        *(undefined8 *)f->lods = uVar6;
        *(undefined8 *)(f->lods + 8) = uVar7;
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0x29);
        uVar6 = puVar1[1];
        *(undefined8 *)f->idtms = *puVar1;
        *(undefined8 *)(f->idtms + 8) = uVar6;
        *(undefined4 *)(f->idtms + 0xf) = *(undefined4 *)((long)puVar11 + lVar13 + 0x38);
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0x3c);
        uVar6 = puVar1[1];
        *(undefined8 *)f->probs = *puVar1;
        *(undefined8 *)(f->probs + 8) = uVar6;
        *(undefined4 *)(f->probs + 0xf) = *(undefined4 *)((long)puVar11 + lVar13 + 0x4b);
        lVar13 = lVar13 + 0x4f;
      }
      else {
        if (f->mcnp_type == 1) {
          *(undefined8 *)f->kods = *(undefined8 *)((long)puVar11 + uVar20);
          f->vers[4] = *(char *)((long)puVar11 + uVar20 + 0xc);
          *(undefined4 *)f->vers = *(undefined4 *)((long)puVar11 + uVar20 + 8);
          puVar1 = (undefined8 *)((long)puVar11 + uVar20 + 0xd);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)puVar11 + uVar20 + 0x19);
          uVar7 = *puVar2;
          uVar8 = puVar2[1];
          *(undefined8 *)f->lods = *puVar1;
          *(undefined8 *)(f->lods + 8) = uVar6;
          *(undefined8 *)(f->lods + 0xc) = uVar7;
          *(undefined8 *)(f->lods + 0x14) = uVar8;
          puVar1 = (undefined8 *)((long)puVar11 + uVar20 + 0x29);
          uVar6 = puVar1[1];
          *(undefined8 *)f->idtms = *puVar1;
          *(undefined8 *)(f->idtms + 8) = uVar6;
          *(undefined2 *)(f->idtms + 0x10) = *(undefined2 *)((long)puVar11 + uVar20 + 0x39);
          memcpy(f->aids,(void *)((long)puVar11 + uVar20 + 0x3b),__n);
          f->probs[0] = '\0';
          goto LAB_00102ba4;
        }
        lVar13 = (long)f->reclen;
        *(undefined8 *)f->kods = *(undefined8 *)((long)puVar11 + lVar13);
        *(undefined4 *)f->vers = *(undefined4 *)((long)puVar11 + lVar13 + 8);
        f->vers[4] = *(char *)((long)puVar11 + lVar13 + 0xc);
        *(undefined8 *)f->lods = *(undefined8 *)((long)puVar11 + lVar13 + 0xd);
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0x15);
        uVar6 = puVar1[1];
        *(undefined8 *)f->idtms = *puVar1;
        *(undefined8 *)(f->idtms + 8) = uVar6;
        *(undefined4 *)(f->idtms + 0xf) = *(undefined4 *)((long)puVar11 + lVar13 + 0x24);
        puVar1 = (undefined8 *)((long)puVar11 + lVar13 + 0x28);
        uVar6 = puVar1[1];
        *(undefined8 *)f->probs = *puVar1;
        *(undefined8 *)(f->probs + 8) = uVar6;
        *(undefined4 *)(f->probs + 0xf) = *(undefined4 *)((long)puVar11 + lVar13 + 0x37);
        lVar13 = lVar13 + 0x3b;
      }
      memcpy(f->aids,(void *)((long)puVar11 + lVar13),0x50);
LAB_00102ba4:
      pcVar17 = f->kods;
      local_48 = pcVar17;
      ssw_strip(&local_48);
      __s1 = f->vers;
      local_48 = __s1;
      ssw_strip(&local_48);
      local_48 = f->lods;
      ssw_strip(&local_48);
      local_48 = f->idtms;
      ssw_strip(&local_48);
      local_48 = f->probs;
      ssw_strip(&local_48);
      local_48 = f->aids;
      ssw_strip(&local_48);
      __ptr = (void *)mcpl_basename(filename);
      pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar15 = _stdout;
      }
      fprintf(pFVar15,"ssw_open_file: Opened file \"%s\":\n",__ptr);
      free(__ptr);
      __s2 = "mcnp";
      if (f->mcnp_type == 2) {
        __s2 = "mcnpx";
      }
      iVar9 = strcmp(pcVar17,__s2);
      if (iVar9 != 0) {
        pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
        if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar15 = _stdout;
        }
        fprintf(pFVar15,"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",pcVar17);
      }
      iVar9 = f->mcnp_type;
      if (iVar9 == 3) {
        iVar9 = strcmp(__s1,"5");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        pcVar17 = 
        "ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
      }
      else if (iVar9 == 2) {
        iVar9 = strcmp(__s1,"2.5.0");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        iVar9 = strcmp(__s1,"2.6.0");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        iVar9 = strcmp(__s1,"2.7.0");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        iVar9 = strcmp(__s1,"26b");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        pcVar17 = 
        "ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
      }
      else {
        if (iVar9 != 1) {
          return (ssw_file_t)f;
        }
        iVar9 = strcmp(__s1,"6");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        iVar9 = strcmp(__s1,"6.mpi");
        if (iVar9 == 0) {
          return (ssw_file_t)f;
        }
        pcVar17 = 
        "ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
      }
      pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar15 = _stdout;
      }
      fprintf(pFVar15,pcVar17,__s1);
      return (ssw_file_t)f;
    }
    pcVar17 = "ssw_open_file error: Unexpected header contents\n";
  }
  ssw_openerror(f,pcVar17);
  if (f == (ssw_fileinternal_t *)0x0) goto LAB_00103225;
  ff = ssw_open_and_procrec0((char *)f);
  iVar9 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
  if (iVar9 == 0) {
    pcVar17 = "ssw_open_file error: problems loading record (A)";
    goto LAB_0010321d;
  }
  uVar12 = *(ulong *)((long)ff.internal + 0x170);
  lVar13 = *(long *)((long)ff.internal + 0x100) - ((long)*ff.internal + uVar12);
  plVar4 = *(long **)((long)ff.internal + 0x180);
  iVar9 = *(int *)((long)ff.internal + 0xf4);
  if (uVar12 < 0x20 || iVar9 != 1) {
    if (uVar12 == 0x14 && iVar9 == 2) {
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar4;
      *(long *)((long)ff.internal + 0x188) = lVar13;
      *(undefined4 *)((long)ff.internal + 0xe0) = *(undefined4 *)((long)plVar4 + 4);
      *(long *)((long)ff.internal + 400) = lVar13 + 4;
      iVar9 = (int)plVar4[1];
      lVar13 = 0x10;
      lVar16 = 0xc;
      goto LAB_00102fb1;
    }
    if (uVar12 == 0x20 && iVar9 == 3) {
      if (*plVar4 - 0x80000000U < 0xffffffff00000001) {
        pcVar17 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 histories are not supported";
      }
      else {
        *(int *)((long)ff.internal + 0xdc) = (int)*plVar4;
        *(long *)((long)ff.internal + 0x188) = lVar13;
        uVar12 = *(ulong *)(*(long *)((long)ff.internal + 0x180) + 8);
        if ((uVar12 & 0xffffffff80000000) == 0) {
          *(int *)((long)ff.internal + 0xe0) = (int)uVar12;
          *(long *)((long)ff.internal + 400) = lVar13 + 8;
          iVar9 = (int)plVar4[2];
          goto LAB_00102e7b;
        }
        pcVar17 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 particles are not supported";
      }
    }
    else {
      if (uVar12 == 0x28) {
        pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
        if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar15 = _stdout;
        }
        fwrite("ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
               ,0x9c,1,pFVar15);
        *(int *)((long)ff.internal + 0xdc) = (int)*plVar4;
        *(long *)((long)ff.internal + 0x188) = lVar13;
        *(int *)((long)ff.internal + 0xe0) = (int)plVar4[1];
        *(long *)((long)ff.internal + 400) = lVar13 + 8;
        iVar9 = (int)plVar4[2];
        lVar13 = 0x20;
        lVar16 = 0x18;
        goto LAB_00102fb1;
      }
      pcVar17 = "ssw_open_file error: Unexpected record length";
    }
  }
  else {
    *(int *)((long)ff.internal + 0xdc) = (int)*plVar4;
    *(long *)((long)ff.internal + 0x188) = lVar13;
    *(int *)((long)ff.internal + 0xe0) = (int)plVar4[1];
    *(long *)((long)ff.internal + 400) = lVar13 + 8;
    iVar21 = (int)plVar4[2];
    iVar9 = -iVar21;
    if (0 < iVar21) {
      iVar9 = iVar21;
    }
LAB_00102e7b:
    lVar13 = 0x18;
    lVar16 = 0x14;
LAB_00102fb1:
    *(int *)((long)ff.internal + 0xe8) = iVar9;
    *(undefined4 *)((long)ff.internal + 0xe4) = *(undefined4 *)((long)plVar4 + lVar16);
    *(undefined4 *)((long)ff.internal + 0xec) = *(undefined4 *)((long)plVar4 + lVar13);
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    pcVar17 = ssw_mcnpflavour(ff);
    fprintf(pFVar15,"ssw_open_file:    File layout detected : %s\n",pcVar17);
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",(long)ff.internal + 4,
            (long)ff.internal + 0xd);
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ssw_open_file:    Title field : \"%s\"\n",(long)ff.internal + 0x58);
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    uVar14 = *(uint *)((long)ff.internal + 0xdc);
    uVar5 = -uVar14;
    if (0 < (int)uVar14) {
      uVar5 = uVar14;
    }
    fprintf(pFVar15,"ssw_open_file:    Source statistics (histories): %11i\n",(ulong)uVar5);
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ssw_open_file:    Particles in file            : %11i\n",
            (ulong)*(uint *)((long)ff.internal + 0xe0));
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ssw_open_file:    Number of surfaces           : %11i\n",
            (ulong)*(uint *)((long)ff.internal + 0xe4));
    pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
    if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
      pFVar15 = _stdout;
    }
    fprintf(pFVar15,"ssw_open_file:    Histories at surfaces        : %11i\n",
            (ulong)*(uint *)((long)ff.internal + 0xec));
    if (*(int *)((long)ff.internal + 0xe8) == 6) {
      pcVar17 = "ssw_open_file error: SSW files with spherical sources are not currently supported."
      ;
    }
    else if (*(int *)((long)ff.internal + 0xe8) < 10) {
      pcVar17 = "ssw_open_file error: Too short SSB arrays in file";
    }
    else if (*(int *)((long)ff.internal + 0xe8) < 0xc) {
      if ((*(int *)((long)ff.internal + 0xf4) == 1) && (*(int *)((long)ff.internal + 0xe8) == 10)) {
        pcVar17 = "ssw_open_file error: Unexpected length of SSB arrays in MCNP6 file";
      }
      else if (*(int *)((long)ff.internal + 0xdc) == 0) {
        pcVar17 = "ssw_open_file error: File has 0 particle histories which should not be possible";
      }
      else {
        iVar9 = 0;
        if (*(int *)((long)ff.internal + 0xdc) < 0) {
          *(int *)((long)ff.internal + 0xdc) = -*(int *)((long)ff.internal + 0xdc);
          iVar9 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
          if (iVar9 == 0) {
            pcVar17 = "ssw_open_file error: problems loading record (B)";
            goto LAB_0010321d;
          }
          iVar9 = (int)*plVar4;
        }
        if (-1 < *(int *)((long)ff.internal + 0xe4) + iVar9) {
          iVar21 = -1;
          do {
            iVar10 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
            if (iVar10 == 0) {
              pcVar17 = "ssw_open_file error: problems loading record (C)";
              goto LAB_0010321d;
            }
            iVar21 = iVar21 + 1;
          } while (iVar21 < *(int *)((long)ff.internal + 0xe4) + iVar9);
        }
        *(undefined4 *)((long)ff.internal + 0xf0) = 0;
        *(undefined8 *)((long)ff.internal + 0x198) = *(undefined8 *)((long)ff.internal + 0x100);
        iVar9 = -3;
        while( true ) {
          iVar21 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
          if (iVar21 == 0) break;
          if ((0 < *(int *)((long)ff.internal + 0xe0)) &&
             (*(ulong *)((long)ff.internal + 0x170) ==
              (ulong)(uint)(*(int *)((long)ff.internal + 0xe8) << 3))) {
            return (ssw_file_t)ff.internal;
          }
          *(long *)((long)ff.internal + 0x198) =
               *(long *)((long)ff.internal + 0x198) +
               *(long *)((long)ff.internal + 0x170) + (long)*ff.internal * 2;
          pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
          if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
            pFVar15 = _stdout;
          }
          fprintf(pFVar15,
                  "ssw_open_file WARNING: Unexpected %llu byte record encountered at end of header. Continuing under the assumption it contains valid configuration data.\n"
                 );
          iVar9 = iVar9 + 1;
          if (iVar9 == 0) {
            return (ssw_file_t)ff.internal;
          }
        }
        if (*(int *)((long)ff.internal + 0xe0) == 0) {
          return (ssw_file_t)ff.internal;
        }
        pcVar17 = "ssw_open_file error: problems loading record (D)";
      }
    }
    else {
      pcVar17 = "ssw_open_file error: Unexpected length of SSB arrays in file";
    }
  }
LAB_0010321d:
  ssw_openerror((ssw_fileinternal_t *)ff.internal,pcVar17);
LAB_00103225:
  pFVar15 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar15 = _stdout;
  }
  fprintf(pFVar15,"ERROR: %s\n","ssw_open_file called with null string for filename");
  exit(1);
}

Assistant:

ssw_file_t ssw_open_and_procrec0( const char * filename )
{
  ssw_fileinternal_t * f = (ssw_fileinternal_t*)calloc(1,sizeof(ssw_fileinternal_t));
  if (!f)
    ssw_error("memory allocation failure");
  f->filehandle.internal = NULL;

  ssw_file_t out;
  out.internal = f;

  //open file (can be gzipped if filename ends with .gz):
  f->filehandle = mcpl_generic_fopen( filename );

  //Prepare buffer. SSWREAD_STDBUFSIZE bytes should always be enough for the
  //first record (guaranteed by the checks below), but it might later grow on
  //demand inside ssw_loadrecord if needed.

  f->lbufmax = SSWREAD_STDBUFSIZE;
  char * buf = malloc(f->lbufmax);
  if (!buf)
    ssw_error("memory allocation failure");
  f->buf = buf;

  //Fortran data is usually written in "records" with an initial and final 32bit
  //or 64bit integer specifying the record byte-length. The tested file-types
  //begin in one of the following ways:
  //
  // 1) 4B[163|167] + KODS : MCNPX2.7.0 with 32bit reclen
  // 2) 8B[163|167] + KODS : MCNPX2.7.0 with 64bit reclen
  // 3) 16B +4B[143 or 191] + KODS : MCNP6 with 32bit reclen
  // 4) 24B +8B[143 or 191] + KODS : MCNP6 with 64bit reclen
  // 5) 4B[143]+KODS : MCNP5 with 32bit reclen.
  // 6) 8B[143]+KODS : MCNP5 with 64bit reclen.
  //
  //Where KODS is 8 bytes representing the "code name" as a string. For pure
  //MCNPX/MCNP6 this string contains "mcnpx" and "mcnp" respectively, but we
  //should allow for custom in-house versions with modified contents of KODS. We
  //do, however, require that the first character or KODS is an ASCII character
  //in the range 32-126 (i.e. non-extended ascii without control or null chars).
  //
  //Note that for option 3) and 4), the second record can have a length of
  //either 143 (MCNP 6.0) or 191 (MCNP 6.2), since the "aids" field increased in
  //size from 80 to 128 chars.
  //
  //Note that for option 3) and 4), the 16B / 24B are a fortran record with 8
  //bytes of data - usually (always?) the string "SF_00001".

  //Thus, we probe the first 36 bytes and search the patterns above:

  ssw_readbytes(f,buf,36);
  uint32_t first32 = *((uint32_t*)buf);
  uint64_t first64 = *((uint64_t*)buf);

  f->reclen = 0;
  f->mcnp_type = SSW_MCNP_NOTFOUND;
  uint64_t lenrec0 = 99999;
  unsigned rec0begin = 0;

  //First look for MCNP6:
  unsigned mcnp6_lenaids = 80;
  if ( first32==8 && *((uint32_t*)(buf+12))==8 && (*((uint32_t*)(buf+16))==143||*((uint32_t*)(buf+16))==191) && buf[20]>=32 && buf[20]<127) {
    //Looks like 3), an mcnp6 file with 32bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 4;
    lenrec0 = *((uint32_t*)(buf+16));
    rec0begin = 20;
    if (*((uint32_t*)(buf+16))==191)
      mcnp6_lenaids = 128;
  } else if ( first32==8 && *((uint64_t*)(buf+16))==8 && (*((uint64_t*)(buf+24))==143||*((uint64_t*)(buf+24))==191) && buf[32]>=32 && buf[32]<127) {
    //Looks like 4), an mcnp6 file with 64bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 8;
    lenrec0 = *((uint64_t*)(buf+24));
    rec0begin = 32;
    if (*((uint64_t*)(buf+24))==191)
      mcnp6_lenaids = 128;
  }

  //Next, look for MCNPX:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( (first32==163||first32==167) && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 1), an mcnpx file with 32bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( (first64==163||first64==167) && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 2), an mcnpx file with 64bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  //Finally, look for MCNP5:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( first32==143 && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 5), an mcnp5 file with 32bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( first64==143 && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 6), an mcnp5 file with 64bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  if ( f->mcnp_type == SSW_MCNP_NOTFOUND )
    ssw_openerror(f,"ssw_open_file error: File does not"
                  " look like a supported MCNP SSW file");

  assert(f->reclen && rec0begin && lenrec0 && lenrec0<99999 );

  if (f->reclen==8) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
  }

  //Finish reading the first record:
  int missingrec0 = (int)(lenrec0 + rec0begin) - (int)36 + f->reclen;
  assert(missingrec0>0);
  ssw_readbytes(f,buf+36,missingrec0);

  //Check final marker:
  uint64_t lenrec0_b;
  if (f->reclen==4)
    lenrec0_b = *((uint32_t*)(buf+(rec0begin+lenrec0)));
  else
    lenrec0_b = *((uint64_t*)(buf+(rec0begin+lenrec0)));
  if (lenrec0!=lenrec0_b)
    ssw_openerror(f,"ssw_open_file error: Unexpected header contents\n");

  //decode first record, inspired by ssw.py:
  if (f->mcnp_type == SSW_MCNP6) {
    char * r = buf + rec0begin;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=18); r += n;
    memcpy(f->aids,r, n=mcnp6_lenaids);
    f->probs[0]='\0';
  } else if (f->mcnp_type == SSW_MCNPX) {
    assert(lenrec0==163||lenrec0==167);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  } else {
    assert(f->mcnp_type == SSW_MCNP5);
    assert(lenrec0==143);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=8); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  }

  char * tmp;
  tmp = f->kods; ssw_strip(&tmp);
  tmp = f->vers; ssw_strip(&tmp);
  tmp = f->lods; ssw_strip(&tmp);
  tmp = f->idtms; ssw_strip(&tmp);
  tmp = f->probs; ssw_strip(&tmp);
  tmp = f->aids; ssw_strip(&tmp);
  char * bn = mcpl_basename(filename);
  fprintf(ssw_stdout(),"ssw_open_file: Opened file \"%s\":\n",bn);
  free(bn);
  const char * expected_kods = (f->mcnp_type == SSW_MCNPX?"mcnpx":"mcnp");
  if (strcmp(f->kods,expected_kods)!=0) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",f->kods);
  }

  if (f->mcnp_type==SSW_MCNP6) {
    if ( strcmp(f->vers,"6")!=0 && strcmp(f->vers,"6.mpi")!=0 ) {
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
    }
  } else if (f->mcnp_type==SSW_MCNPX) {
    if ( strcmp(f->vers,"2.5.0")!=0 && strcmp(f->vers,"2.6.0")!=0
         && strcmp(f->vers,"2.7.0")!=0 && strcmp(f->vers,"26b")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  } else if (f->mcnp_type==SSW_MCNP5) {
    if ( strcmp(f->vers,"5")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  }

  return out;
}